

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  entropy->entropy = 0.0;
  entropy->max_val = 0;
  entropy->nonzero_code = 0;
  entropy->max_val = 0;
  entropy->nonzero_code = 0xffffffff;
  if (0 < n) {
    uVar5 = 0;
    do {
      uVar3 = array[uVar5];
      if (uVar3 != 0) {
        entropy->nonzero_code = (uint32_t)uVar5;
        uVar1 = entropy->sum;
        uVar2 = entropy->nonzeros;
        entropy->sum = uVar3 + uVar1;
        entropy->nonzeros = uVar2 + 1;
        uVar4 = array[uVar5];
        if ((ulong)uVar4 < 0x100) {
          fVar6 = kSLog2Table[uVar4];
        }
        else {
          fVar6 = (*VP8LFastSLog2Slow)(uVar4);
        }
        entropy->entropy = entropy->entropy - (double)fVar6;
        if (entropy->max_val < array[uVar5]) {
          entropy->max_val = array[uVar5];
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  uVar4 = entropy->sum;
  if ((ulong)uVar4 < 0x100) {
    fVar6 = kSLog2Table[uVar4];
  }
  else {
    fVar6 = (*VP8LFastSLog2Slow)(uVar4);
  }
  entropy->entropy = (double)fVar6 + entropy->entropy;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* const array, int n,
                              VP8LBitEntropy* const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy -= VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy += VP8LFastSLog2(entropy->sum);
}